

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_imply_m(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_STATUS RVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_158 [4];
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  REF_DBL aRStack_38 [6];
  
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    m[lVar5] = 0.0;
  }
  dVar11 = *xyz1;
  dVar8 = xyz1[1];
  local_48 = xyz1[2];
  dVar1 = *xyz2;
  dVar13 = *xyz0;
  dVar6 = xyz0[1];
  local_58 = xyz0[2];
  dVar7 = dVar11 - dVar13;
  dVar9 = dVar1 - dVar13;
  local_158[0] = dVar7 * dVar7;
  local_158[1] = dVar9 * dVar9;
  dVar2 = xyz2[1];
  dVar10 = dVar8 - dVar6;
  dVar12 = dVar2 - dVar6;
  local_128 = (dVar7 + dVar7) * dVar10;
  dStack_120 = (dVar9 + dVar9) * dVar12;
  dVar3 = xyz2[2];
  local_68 = local_48 - local_58;
  dStack_60 = dVar3 - local_58;
  local_f8 = (dVar7 + dVar7) * local_68;
  dStack_f0 = (dVar9 + dVar9) * dStack_60;
  local_c8 = dVar10 * dVar10;
  dStack_c0 = dVar12 * dVar12;
  local_98 = (dVar10 + dVar10) * local_68;
  dStack_90 = (dVar12 + dVar12) * dStack_60;
  local_68 = local_68 * local_68;
  dStack_60 = dStack_60 * dStack_60;
  dVar7 = *xyz3;
  dVar9 = xyz3[1];
  dStack_40 = xyz3[2];
  dVar13 = dVar7 - dVar13;
  dVar12 = dVar1 - dVar11;
  local_158[2] = dVar13 * dVar13;
  local_158[3] = dVar12 * dVar12;
  dVar6 = dVar9 - dVar6;
  dVar10 = dVar2 - dVar8;
  local_118 = (dVar13 + dVar13) * dVar6;
  dStack_110 = (dVar12 + dVar12) * dVar10;
  local_58 = dStack_40 - local_58;
  dStack_50 = dVar3 - local_48;
  local_e8 = (dVar13 + dVar13) * local_58;
  dStack_e0 = (dVar12 + dVar12) * dStack_50;
  local_b8 = dVar6 * dVar6;
  dStack_b0 = dVar10 * dVar10;
  local_88 = (dVar6 + dVar6) * local_58;
  dStack_80 = (dVar10 + dVar10) * dStack_50;
  local_58 = local_58 * local_58;
  dStack_50 = dStack_50 * dStack_50;
  dVar11 = dVar7 - dVar11;
  dVar7 = dVar7 - dVar1;
  local_138 = dVar11 * dVar11;
  dStack_130 = dVar7 * dVar7;
  dVar8 = dVar9 - dVar8;
  dVar9 = dVar9 - dVar2;
  local_108 = (dVar11 + dVar11) * dVar8;
  dStack_100 = (dVar7 + dVar7) * dVar9;
  local_48 = dStack_40 - local_48;
  dStack_40 = dStack_40 - dVar3;
  local_d8 = (dVar11 + dVar11) * local_48;
  dStack_d0 = (dVar7 + dVar7) * dStack_40;
  local_a8 = dVar8 * dVar8;
  dStack_a0 = dVar9 * dVar9;
  local_78 = (dVar8 + dVar8) * local_48;
  dStack_70 = (dVar9 + dVar9) * dStack_40;
  local_48 = local_48 * local_48;
  dStack_40 = dStack_40 * dStack_40;
  for (lVar5 = 0x24; lVar5 != 0x2a; lVar5 = lVar5 + 1) {
    local_158[lVar5] = 1.0;
  }
  RVar4 = ref_matrix_solve_ab(6,7,local_158);
  if (RVar4 == 0) {
    RVar4 = 0;
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      m[lVar5] = aRStack_38[lVar5];
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                      REF_DBL *xyz2, REF_DBL *xyz3) {
  REF_DBL ab[42];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab(0, xyz1, xyz0);
  fill_ab(1, xyz2, xyz0);
  fill_ab(2, xyz3, xyz0);
  fill_ab(3, xyz2, xyz1);
  fill_ab(4, xyz3, xyz1);
  fill_ab(5, xyz3, xyz2);

  for (i = 0; i < 6; i++) ab[i + 6 * 6] = 1.0;

  RAISE(ref_matrix_solve_ab(6, 7, ab));

  for (i = 0; i < 6; i++) m[i] = ab[i + 6 * 6];

  return REF_SUCCESS;
}